

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperEQ
          (internal *this,char *expected_expression,char *actual_expression,BiggestInt expected,
          BiggestInt actual)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar1;
  String local_58;
  String local_48;
  BiggestInt local_38;
  BiggestInt local_30;
  
  if (expected == actual) {
    *this = (internal)0x1;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    local_38 = actual;
    local_30 = expected;
    FormatForComparisonFailureMessage<long_long,long_long>((longlong *)&local_48,&local_30);
    FormatForComparisonFailureMessage<long_long,long_long>((longlong *)&local_58,&local_38);
    AVar1 = EqFailure(this,expected_expression,actual_expression,&local_48,&local_58,false);
    actual_expression = (char *)AVar1.message_.ptr_;
    if (local_58.c_str_ != (char *)0x0) {
      operator_delete__(local_58.c_str_);
      actual_expression = (char *)extraout_RDX;
    }
    if (local_48.c_str_ != (char *)0x0) {
      operator_delete__(local_48.c_str_);
      actual_expression = (char *)extraout_RDX_00;
    }
  }
  AVar1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)actual_expression;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            BiggestInt expected,
                            BiggestInt actual) {
  if (expected == actual) {
    return AssertionSuccess();
  }

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}